

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
serial::Serial::readlines
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Serial *this,size_t size,string *eol)

{
  long lVar1;
  char *pcVar2;
  ulong uVar3;
  allocator *paVar4;
  Serial *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  string *__rhs;
  uint8_t *puVar6;
  undefined8 uStack_1b0;
  undefined1 auStack_1a8 [8];
  char *local_1a0;
  ulong local_198;
  allocator *local_190;
  char *local_188;
  ulong local_180;
  allocator *local_178;
  byte local_169;
  char *local_168;
  uint8_t *local_160;
  allocator *local_158;
  char *local_150;
  ulong local_148;
  allocator *local_140;
  size_t local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_130;
  Serial *local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_120;
  string *local_118;
  allocator local_109;
  value_type local_108;
  allocator local_e1;
  value_type local_e0;
  allocator local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  allocator local_91;
  value_type local_90;
  size_t local_60;
  size_t bytes_read;
  size_t start_of_line;
  size_t read_so_far;
  uint8_t *buffer_;
  size_t eol_len;
  ScopedReadLock local_30;
  ScopedReadLock lock;
  string *eol_local;
  size_t size_local;
  Serial *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lines;
  
  uStack_1b0 = 0x10e66b;
  local_130 = __return_storage_ptr__;
  local_128 = this;
  local_120 = __return_storage_ptr__;
  local_118 = eol;
  lock.pimpl_ = (SerialImpl *)eol;
  ScopedReadLock::ScopedReadLock(&local_30,this->pimpl_);
  eol_len._7_1_ = 0;
  uStack_1b0 = 0x10e67b;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_120);
  uStack_1b0 = 0x10e687;
  buffer_ = (uint8_t *)std::__cxx11::string::length();
  lVar1 = -(size + 0xf & 0xfffffffffffffff0);
  read_so_far = (size_t)(auStack_1a8 + lVar1);
  start_of_line = 0;
  bytes_read = 0;
  do {
    this_00 = local_128;
    if (size <= start_of_line) goto LAB_0010ea3c;
    puVar6 = (uint8_t *)(read_so_far + start_of_line);
    *(undefined8 *)(auStack_1a8 + lVar1 + -8) = 0x10e6de;
    local_138 = read_(this_00,puVar6,1);
    start_of_line = local_138 + start_of_line;
    local_60 = local_138;
    if (local_138 == 0) {
      if (bytes_read != start_of_line) {
        local_150 = (char *)(read_so_far + bytes_read);
        local_148 = start_of_line - bytes_read;
        local_140 = &local_91;
        *(undefined8 *)(auStack_1a8 + lVar1 + -8) = 0x10e74a;
        std::allocator<char>::allocator();
        paVar4 = local_140;
        uVar3 = local_148;
        pcVar2 = local_150;
        *(undefined8 *)(auStack_1a8 + lVar1 + -8) = 0x10e76b;
        std::__cxx11::string::string((string *)&local_90,pcVar2,uVar3,paVar4);
        pvVar5 = local_120;
        *(undefined8 *)(auStack_1a8 + lVar1 + -8) = 0x10e780;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pvVar5,&local_90);
        *(undefined8 *)(auStack_1a8 + lVar1 + -8) = 0x10e78e;
        std::__cxx11::string::~string((string *)&local_90);
        *(undefined8 *)(auStack_1a8 + lVar1 + -8) = 0x10e79a;
        std::allocator<char>::~allocator((allocator<char> *)&local_91);
      }
      goto LAB_0010ea3c;
    }
    local_160 = buffer_;
    local_168 = (char *)((read_so_far + start_of_line) - (long)buffer_);
    local_158 = &local_b9;
    *(undefined8 *)(auStack_1a8 + lVar1 + -8) = 0x10e81c;
    std::allocator<char>::allocator();
    paVar4 = local_158;
    puVar6 = local_160;
    pcVar2 = local_168;
    *(undefined8 *)(auStack_1a8 + lVar1 + -8) = 0x10e83d;
    std::__cxx11::string::string((string *)&local_b8,pcVar2,(ulong)puVar6,paVar4);
    __rhs = local_118;
    *(undefined8 *)(auStack_1a8 + lVar1 + -8) = 0x10e852;
    local_169 = std::operator==(&local_b8,__rhs);
    *(undefined8 *)(auStack_1a8 + lVar1 + -8) = 0x10e864;
    std::__cxx11::string::~string((string *)&local_b8);
    *(undefined8 *)(auStack_1a8 + lVar1 + -8) = 0x10e870;
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    if ((local_169 & 1) != 0) {
      local_188 = (char *)(read_so_far + bytes_read);
      local_180 = start_of_line - bytes_read;
      local_178 = &local_e1;
      *(undefined8 *)(auStack_1a8 + lVar1 + -8) = 0x10e8b2;
      std::allocator<char>::allocator();
      paVar4 = local_178;
      uVar3 = local_180;
      pcVar2 = local_188;
      *(undefined8 *)(auStack_1a8 + lVar1 + -8) = 0x10e8d3;
      std::__cxx11::string::string((string *)&local_e0,pcVar2,uVar3,paVar4);
      pvVar5 = local_120;
      *(undefined8 *)(auStack_1a8 + lVar1 + -8) = 0x10e8e8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar5,&local_e0);
      *(undefined8 *)(auStack_1a8 + lVar1 + -8) = 0x10e8f6;
      std::__cxx11::string::~string((string *)&local_e0);
      *(undefined8 *)(auStack_1a8 + lVar1 + -8) = 0x10e902;
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      bytes_read = start_of_line;
    }
  } while (start_of_line != size);
  if (bytes_read != start_of_line) {
    local_1a0 = (char *)(read_so_far + bytes_read);
    local_198 = start_of_line - bytes_read;
    local_190 = &local_109;
    *(undefined8 *)(auStack_1a8 + lVar1 + -8) = 0x10e9af;
    std::allocator<char>::allocator();
    paVar4 = local_190;
    uVar3 = local_198;
    pcVar2 = local_1a0;
    *(undefined8 *)(auStack_1a8 + lVar1 + -8) = 0x10e9d0;
    std::__cxx11::string::string((string *)&local_108,pcVar2,uVar3,paVar4);
    pvVar5 = local_120;
    *(undefined8 *)(auStack_1a8 + lVar1 + -8) = 0x10e9e5;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar5,&local_108);
    *(undefined8 *)(auStack_1a8 + lVar1 + -8) = 0x10e9f3;
    std::__cxx11::string::~string((string *)&local_108);
    *(undefined8 *)(auStack_1a8 + lVar1 + -8) = 0x10e9ff;
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
LAB_0010ea3c:
  eol_len._7_1_ = 1;
  *(undefined8 *)(auStack_1a8 + lVar1 + -8) = 0x10ea5b;
  ScopedReadLock::~ScopedReadLock(&local_30);
  return local_130;
}

Assistant:

vector<string>
Serial::readlines (size_t size, string eol)
{
  ScopedReadLock lock(this->pimpl_);
  std::vector<std::string> lines;
  size_t eol_len = eol.length ();
  uint8_t *buffer_ = static_cast<uint8_t*>
    (alloca (size * sizeof (uint8_t)));
  size_t read_so_far = 0;
  size_t start_of_line = 0;
  while (read_so_far < size) {
    size_t bytes_read = this->read_ (buffer_+read_so_far, 1);
    read_so_far += bytes_read;
    if (bytes_read == 0) {
      if (start_of_line != read_so_far) {
        lines.push_back (
          string (reinterpret_cast<const char*> (buffer_ + start_of_line),
            read_so_far - start_of_line));
      }
      break; // Timeout occured on reading 1 byte
    }
    if (string (reinterpret_cast<const char*>
         (buffer_ + read_so_far - eol_len), eol_len) == eol) {
      // EOL found
      lines.push_back(
        string(reinterpret_cast<const char*> (buffer_ + start_of_line),
          read_so_far - start_of_line));
      start_of_line = read_so_far;
    }
    if (read_so_far == size) {
      if (start_of_line != read_so_far) {
        lines.push_back(
          string(reinterpret_cast<const char*> (buffer_ + start_of_line),
            read_so_far - start_of_line));
      }
      break; // Reached the maximum read length
    }
  }
  return lines;
}